

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void CreateDefaultClassAssignment
               (ExpressionContext *ctx,SynBase *source,ExprClassDefinition *classDefinition)

{
  FunctionData *type;
  TypeBase *pTVar1;
  Allocator *pAVar2;
  ScopeData *scope;
  ArgumentData *pAVar3;
  TypeBase *pTVar4;
  ExprBase **ppEVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  VariableData *pVVar8;
  undefined8 uVar9;
  FunctionData *pFVar10;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  int iVar11;
  TypeRef *pTVar12;
  ExprBase *pEVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FunctionData *pFVar14;
  undefined4 extraout_var_02;
  SynIdentifier *pSVar15;
  undefined4 extraout_var_04;
  TypeFunction *pTVar16;
  SynBase *pSVar17;
  ExprVariableDefinition *pEVar18;
  ExprBase *pEVar19;
  undefined4 extraout_var_05;
  _func_int **pp_Var20;
  undefined4 extraout_var_07;
  long lVar21;
  SmallArray<FunctionValue,_32U> *pSVar22;
  char *pcVar23;
  uint uVar24;
  ulong uVar25;
  undefined8 *puVar26;
  MatchData *pMVar27;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ArgumentData> arguments_02;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_03;
  InplaceStr name_00;
  InplaceStr name_01;
  FunctionValue bestOverload;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<VariableHandle> customAssignMembers;
  SmallArray<ArgumentData,_2U> arguments;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<FunctionValue,_32U> functions;
  FunctionValue local_4f8;
  IntrusiveList<ExprBase> local_4d8;
  IntrusiveList<VariableHandle> local_4c8;
  undefined1 local_4b8 [8];
  undefined8 uStack_4b0;
  SynBase local_4a8;
  Allocator *local_448;
  SynBase *local_438;
  uint uStack_430;
  undefined4 uStack_42c;
  SynBase *local_428;
  uint uStack_420;
  undefined4 uStack_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e8 [8];
  ExprBase *pEStack_3e0;
  ExprBase local_3d8 [2];
  Allocator *local_358;
  undefined1 auStack_350 [8];
  SmallArray<FunctionValue,_32U> local_348;
  VariableHandle *node;
  undefined4 extraout_var_03;
  undefined4 extraout_var_06;
  
  ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  type = (FunctionData *)classDefinition->classType;
  local_4c8.head = (VariableHandle *)0x0;
  local_4c8.tail = (VariableHandle *)0x0;
  pMVar27 = (type->aliases).tail;
  if (pMVar27 == (MatchData *)0x0) {
LAB_001692d5:
    RestoreParentTypeScope(ctx,source,(TypeBase *)classDefinition->classType);
    return;
  }
  do {
    pTVar1 = (TypeBase *)pMVar27->type->importModule;
    if ((pTVar1 == (TypeBase *)0x0) || ((3 < pTVar1->typeID - 0x12 && (pTVar1->typeID != 0)))) {
      pAVar2 = ctx->allocator;
      lVar21 = 0x20;
      do {
        *(undefined8 *)((long)&local_4c8.head + lVar21) = 0;
        local_4b8[lVar21 + -8] = 0;
        *(undefined8 *)(local_4b8 + lVar21) = 0;
        *(undefined8 *)((long)&uStack_4b0 + lVar21) = 0;
        *(undefined8 *)((long)&local_4a8._vptr_SynBase + lVar21) = 0;
        *(undefined8 *)((long)&local_4a8.typeID + lVar21) = 0;
        lVar21 = lVar21 + 0x30;
      } while (lVar21 != 0x80);
      local_4b8 = (undefined1  [8])&local_4a8;
      uStack_4b0 = (FunctionData *)0x200000000;
      local_448 = pAVar2;
      pTVar12 = ExpressionContext::GetReferenceType(ctx,pTVar1);
      if ((uint)uStack_4b0 == uStack_4b0._4_4_) {
        SmallArray<ArgumentData,_2U>::grow
                  ((SmallArray<ArgumentData,_2U> *)local_4b8,(uint)uStack_4b0);
      }
      if (local_4b8 == (undefined1  [8])0x0) goto LAB_001692fb;
      uVar25 = (ulong)uStack_4b0 & 0xffffffff;
      uVar24 = (uint)uStack_4b0 + 1;
      uStack_4b0 = (FunctionData *)CONCAT44(uStack_4b0._4_4_,uVar24);
      ((SynBase **)local_4b8)[uVar25 * 6] = source;
      ((bool *)((long)local_4b8 + 8))[uVar25 * 0x30] = false;
      ((SynIdentifier **)((long)local_4b8 + 0x10))[uVar25 * 6] = (SynIdentifier *)0x0;
      ((TypeBase **)((long)local_4b8 + 0x18))[uVar25 * 6] = &pTVar12->super_TypeBase;
      ((InplaceStr *)((long)local_4b8 + 0x20))[uVar25 * 3].begin = (char *)0x0;
      ((InplaceStr *)((long)local_4b8 + 0x20))[uVar25 * 3].end = (char *)0x0;
      if (uVar24 == uStack_4b0._4_4_) {
        SmallArray<ArgumentData,_2U>::grow((SmallArray<ArgumentData,_2U> *)local_4b8,uVar24);
      }
      if (local_4b8 == (undefined1  [8])0x0) goto LAB_001692fb;
      uVar25 = (ulong)uStack_4b0 & 0xffffffff;
      uStack_4b0 = (FunctionData *)CONCAT44(uStack_4b0._4_4_,(uint)uStack_4b0 + 1);
      pSVar22 = (SmallArray<FunctionValue,_32U> *)(uVar25 * 0x30);
      *(SynBase **)
       ((long)&pSVar22->little[0].source + (long)&((SynBase *)((long)local_4b8 + -0x40))->next) =
           source;
      ((bool *)((long)local_4b8 + 8))[(long)pSVar22] = false;
      ((SynIdentifier **)((long)local_4b8 + 0x10))[uVar25 * 6] = (SynIdentifier *)0x0;
      ((TypeBase **)((long)local_4b8 + 0x18))[uVar25 * 6] = pTVar1;
      ((InplaceStr *)((long)local_4b8 + 0x20))[uVar25 * 3].begin = (char *)0x0;
      ((InplaceStr *)((long)local_4b8 + 0x20))[uVar25 * 3].end = (char *)0x0;
      name_00.end = "";
      name_00.begin = "=";
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pSVar22;
      pEVar13 = CreateVariableAccess
                          (ctx,source,(IntrusiveList<SynIdentifier>)(auVar7 << 0x40),name_00,false);
      if (pEVar13 == (ExprBase *)0x0) {
LAB_00168ad5:
        name_01.end = "";
        name_01.begin = "default_assign$_";
        auVar6._8_8_ = 0;
        auVar6._0_8_ = pSVar22;
        pEVar13 = CreateVariableAccess
                            (ctx,source,(IntrusiveList<SynIdentifier>)(auVar6 << 0x40),name_01,false
                            );
        if (pEVar13 != (ExprBase *)0x0) {
          pAVar2 = ctx->allocator;
          memset(local_348.little,0,0x300);
          local_348.count = 0;
          local_348.max = 0x20;
          local_348.data = local_348.little;
          local_348.allocator = pAVar2;
          GetNodeFunctions(ctx,source,pEVar13,&local_348);
          if (local_348.count != 0) {
            local_358 = ctx->allocator;
            local_3e8 = (undefined1  [8])local_3d8;
            pEStack_3e0 = (ExprBase *)0x2000000000;
            local_408 = 0;
            uStack_400 = 0;
            local_438 = (SynBase *)local_4b8;
            uStack_430 = (uint)uStack_4b0;
            arguments_01._12_4_ = uStack_42c;
            arguments_01.count = (uint)uStack_4b0;
            arguments_01.data = (ArgumentData *)local_4b8;
            functions_01.count = local_348.count;
            functions_01.data = local_348.data;
            functions_01._12_4_ = 0;
            SelectBestFunction(&local_4f8,ctx,source,functions_01,
                               (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_01,
                               (SmallArray<unsigned_int,_32U> *)local_3e8);
            if (local_4f8.function != (FunctionData *)0x0) {
              iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              node = (VariableHandle *)CONCAT44(extraout_var_00,iVar11);
              goto LAB_00168c1a;
            }
            goto LAB_00168c3d;
          }
          goto LAB_00168c4a;
        }
      }
      else {
        pAVar2 = ctx->allocator;
        memset(local_348.little,0,0x300);
        local_348.count = 0;
        local_348.max = 0x20;
        pSVar22 = &local_348;
        local_348.data = local_348.little;
        local_348.allocator = pAVar2;
        GetNodeFunctions(ctx,source,pEVar13,&local_348);
        if (local_348.count == 0) {
LAB_00168acd:
          SmallArray<FunctionValue,_32U>::~SmallArray(&local_348);
          goto LAB_00168ad5;
        }
        local_358 = ctx->allocator;
        local_3e8 = (undefined1  [8])local_3d8;
        pEStack_3e0 = (ExprBase *)0x2000000000;
        local_3f8 = 0;
        uStack_3f0 = 0;
        local_428 = (SynBase *)local_4b8;
        uStack_420 = (uint)uStack_4b0;
        arguments_00._12_4_ = uStack_41c;
        arguments_00.count = (uint)uStack_4b0;
        arguments_00.data = (ArgumentData *)local_4b8;
        functions_00.count = local_348.count;
        functions_00.data = local_348.data;
        functions_00._12_4_ = 0;
        pSVar22 = (SmallArray<FunctionValue,_32U> *)local_348.data;
        SelectBestFunction(&local_4f8,ctx,source,functions_00,(IntrusiveList<TypeHandle>)ZEXT816(0),
                           arguments_00,(SmallArray<unsigned_int,_32U> *)local_3e8);
        if (local_4f8.function == (FunctionData *)0x0) {
          SmallArray<unsigned_int,_32U>::~SmallArray((SmallArray<unsigned_int,_32U> *)local_3e8);
          goto LAB_00168acd;
        }
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        node = (VariableHandle *)CONCAT44(extraout_var,iVar11);
LAB_00168c1a:
        pVVar8 = (VariableData *)pMVar27->type;
        node->source = &pMVar27->name->super_SynBase;
        node->variable = pVVar8;
        node->next = (VariableHandle *)0x0;
        node->listed = false;
        IntrusiveList<VariableHandle>::push_back(&local_4c8,node);
LAB_00168c3d:
        SmallArray<unsigned_int,_32U>::~SmallArray((SmallArray<unsigned_int,_32U> *)local_3e8);
LAB_00168c4a:
        SmallArray<FunctionValue,_32U>::~SmallArray(&local_348);
      }
      SmallArray<ArgumentData,_2U>::~SmallArray((SmallArray<ArgumentData,_2U> *)local_4b8);
    }
    pMVar27 = *(MatchData **)&pMVar27->listed;
  } while (pMVar27 != (MatchData *)0x0);
  if (local_4c8.head == (VariableHandle *)0x0) goto LAB_001692d5;
  pSVar17 = (SynBase *)ctx->allocator;
  lVar21 = 0x20;
  do {
    *(undefined8 *)(auStack_350 + lVar21 + -8) = 0;
    auStack_350[lVar21] = 0;
    *(undefined8 *)((long)local_348.little + lVar21 + -0x10) = 0;
    *(undefined8 *)((long)local_348.little + lVar21 + -8) = 0;
    *(undefined8 *)((long)&local_348.little[0].source + lVar21) = 0;
    *(undefined8 *)((long)&local_348.little[0].function + lVar21) = 0;
    lVar21 = lVar21 + 0x30;
  } while (lVar21 != 0x80);
  local_348.data = local_348.little;
  local_348.count = 0;
  local_348.max = 2;
  local_348.little[4].source = pSVar17;
  iVar11 = (*pSVar17->_vptr_SynBase[2])(pSVar17,0x50);
  pSVar17 = (SynBase *)CONCAT44(extraout_var_01,iVar11);
  pSVar17->typeID = 4;
  pSVar17->begin = (Lexeme *)0x0;
  pSVar17->end = (Lexeme *)0x0;
  (pSVar17->pos).begin = (char *)0x0;
  (pSVar17->pos).end = (char *)0x0;
  *(undefined8 *)((long)&(pSVar17->pos).end + 2) = 0;
  *(undefined8 *)((long)&pSVar17->next + 2) = 0;
  pSVar17->_vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
  pSVar17[1]._vptr_SynBase = (_func_int **)"$left";
  *(char **)&pSVar17[1].typeID = "";
  pFVar14 = (FunctionData *)ExpressionContext::GetReferenceType(ctx,(TypeBase *)type);
  if (local_348.count == local_348.max) {
    SmallArray<ArgumentData,_2U>::grow((SmallArray<ArgumentData,_2U> *)&local_348,local_348.count);
  }
  if ((SmallArray<FunctionValue,_32U> *)local_348.data != (SmallArray<FunctionValue,_32U> *)0x0) {
    uVar25 = (ulong)local_348.count;
    local_348.count = local_348.count + 1;
    ((FunctionValue *)&(local_348.data)->context)[uVar25 * 2 + -1].function = (FunctionData *)source
    ;
    *(undefined1 *)&((FunctionValue *)&(local_348.data)->context)[uVar25 * 2 + -1].context = 0;
    ((FunctionValue *)&(local_348.data)->context)[uVar25 * 2].source = pSVar17;
    ((FunctionValue *)&(local_348.data)->context)[uVar25 * 2].function = pFVar14;
    ppEVar5 = &((FunctionValue *)&(local_348.data)->context)[uVar25 * 2].context;
    *ppEVar5 = (ExprBase *)0x0;
    ppEVar5[1] = (ExprBase *)0x0;
    iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar17 = (SynBase *)CONCAT44(extraout_var_02,iVar11);
    pSVar17->typeID = 4;
    pSVar17->begin = (Lexeme *)0x0;
    pSVar17->end = (Lexeme *)0x0;
    (pSVar17->pos).begin = (char *)0x0;
    (pSVar17->pos).end = (char *)0x0;
    *(undefined8 *)((long)&(pSVar17->pos).end + 2) = 0;
    *(undefined8 *)((long)&pSVar17->next + 2) = 0;
    pSVar17->_vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
    pSVar17[1]._vptr_SynBase = (_func_int **)"$right";
    *(char **)&pSVar17[1].typeID = "";
    if (local_348.count == local_348.max) {
      SmallArray<ArgumentData,_2U>::grow((SmallArray<ArgumentData,_2U> *)&local_348,local_348.count)
      ;
    }
    if ((SmallArray<FunctionValue,_32U> *)local_348.data != (SmallArray<FunctionValue,_32U> *)0x0) {
      uVar25 = (ulong)local_348.count;
      local_348.count = local_348.count + 1;
      ((FunctionValue *)&(local_348.data)->context)[uVar25 * 2 + -1].function =
           (FunctionData *)source;
      *(undefined1 *)&((FunctionValue *)&(local_348.data)->context)[uVar25 * 2 + -1].context = 0;
      ((FunctionValue *)&(local_348.data)->context)[uVar25 * 2].source = pSVar17;
      ((FunctionValue *)&(local_348.data)->context)[uVar25 * 2].function = type;
      ppEVar5 = &((FunctionValue *)&(local_348.data)->context)[uVar25 * 2].context;
      *ppEVar5 = (ExprBase *)0x0;
      ppEVar5[1] = (ExprBase *)0x0;
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar15 = (SynIdentifier *)CONCAT44(extraout_var_03,iVar11);
      (pSVar15->super_SynBase).typeID = 4;
      (pSVar15->super_SynBase).begin = (Lexeme *)0x0;
      (pSVar15->super_SynBase).end = (Lexeme *)0x0;
      (pSVar15->super_SynBase).pos.begin = (char *)0x0;
      (pSVar15->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(pSVar15->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(pSVar15->super_SynBase).next + 2) = 0;
      (pSVar15->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
      (pSVar15->name).begin = "default_assign$_";
      (pSVar15->name).end = "";
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
      pFVar14 = (FunctionData *)CONCAT44(extraout_var_04,iVar11);
      pAVar2 = ctx->allocator;
      scope = ctx->scope;
      arguments_02.count = local_348.count;
      arguments_02.data = (ArgumentData *)local_348.data;
      arguments_02._12_4_ = 0;
      pTVar16 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments_02);
      pTVar12 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
      local_418 = 0;
      uStack_410 = 0;
      uVar24 = ctx->uniqueFunctionId;
      ctx->uniqueFunctionId = uVar24 + 1;
      pcVar23 = (char *)0x0;
      FunctionData::FunctionData
                (pFVar14,pAVar2,source,scope,false,false,false,pTVar16,&pTVar12->super_TypeBase,
                 pSVar15,(IntrusiveList<MatchData>)ZEXT816(0),uVar24);
      (type->arguments).little[3].type = (TypeBase *)pFVar14;
      if (local_348.count != 0) {
        lVar21 = 0;
        uVar25 = 0;
        do {
          puVar26 = (undefined8 *)((long)&(local_348.data)->context + lVar21 + -0x10);
          uVar24 = (pFVar14->arguments).count;
          if (uVar24 == (pFVar14->arguments).max) {
            SmallArray<ArgumentData,_4U>::grow(&pFVar14->arguments,uVar24);
          }
          pAVar3 = (pFVar14->arguments).data;
          if (pAVar3 == (ArgumentData *)0x0) {
            pcVar23 = 
            "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]";
            goto LAB_00169327;
          }
          uVar24 = (pFVar14->arguments).count;
          (pFVar14->arguments).count = uVar24 + 1;
          pSVar17 = (SynBase *)*puVar26;
          uVar9 = puVar26[1];
          pSVar15 = (SynIdentifier *)puVar26[2];
          pTVar1 = (TypeBase *)puVar26[3];
          pFVar10 = (FunctionData *)puVar26[5];
          pAVar3[uVar24].value = (ExprBase *)puVar26[4];
          (&pAVar3[uVar24].value)[1] = (ExprBase *)pFVar10;
          pAVar3[uVar24].name = pSVar15;
          (&pAVar3[uVar24].name)[1] = (SynIdentifier *)pTVar1;
          pAVar3[uVar24].source = pSVar17;
          *(undefined8 *)&pAVar3[uVar24].isExplicit = uVar9;
          uVar25 = uVar25 + 1;
          lVar21 = lVar21 + 0x30;
        } while (uVar25 < local_348.count);
      }
      name.end = pcVar23;
      name.begin = (pFVar14->name->name).end;
      anon_unknown.dwarf_9c70f::CheckFunctionConflict
                ((anon_unknown_dwarf_9c70f *)ctx,(ExpressionContext *)source,
                 (SynBase *)(pFVar14->name->name).begin,name);
      ExpressionContext::AddFunction(ctx,pFVar14);
      ExpressionContext::PushScope(ctx,pFVar14);
      pFVar14->functionScope = ctx->scope;
      local_4f8.source = (SynBase *)0x0;
      local_4f8.function = (FunctionData *)0x0;
      arguments_03.count = local_348.count;
      arguments_03.data = (ArgumentData *)local_348.data;
      arguments_03._12_4_ = 0;
      CreateFunctionArgumentVariables
                (ctx,source,pFVar14,arguments_03,(IntrusiveList<ExprVariableDefinition> *)&local_4f8
                );
      pSVar17 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pEVar18 = CreateFunctionContextArgument(ctx,pSVar17,pFVar14);
      pFVar14->argumentsSize = pFVar14->functionScope->dataSize;
      local_4d8.head = (ExprBase *)0x0;
      local_4d8.tail = (ExprBase *)0x0;
      pMVar27 = (type->aliases).tail;
      if (pMVar27 != (MatchData *)0x0) {
        do {
          pEVar13 = CreateVariableAccess
                              (ctx,source,*(VariableData **)&(local_4f8.source)->next->typeID,false)
          ;
          pEVar13 = CreateMemberAccess(ctx,source,pEVar13,
                                       *(SynIdentifier **)&pMVar27->type->typeIndex,false);
          pEVar19 = CreateVariableAccess
                              (ctx,source,
                               (VariableData *)
                               ((ExprBase *)((local_4f8.source)->pos).begin)[1]._vptr_ExprBase[1],
                               false);
          pEVar19 = CreateMemberAccess(ctx,source,pEVar19,
                                       *(SynIdentifier **)&pMVar27->type->typeIndex,false);
          pEVar13 = CreateAssignment(ctx,source,pEVar13,pEVar19);
          IntrusiveList<ExprBase>::push_back(&local_4d8,pEVar13);
          pMVar27 = *(MatchData **)&pMVar27->listed;
        } while (pMVar27 != (MatchData *)0x0);
      }
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_05,iVar11);
      pTVar1 = ctx->typeVoid;
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pp_Var20 = (_func_int **)CONCAT44(extraout_var_06,iVar11);
      pTVar4 = ctx->typeVoid;
      *(undefined4 *)(pp_Var20 + 1) = 2;
      pp_Var20[2] = (_func_int *)source;
      pp_Var20[3] = (_func_int *)pTVar4;
      pp_Var20[4] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var20 + 5) = 0;
      *pp_Var20 = (_func_int *)&PTR__ExprBase_00223698;
      pEVar13->typeID = 0x1c;
      pEVar13->source = source;
      pEVar13->type = pTVar1;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
      pEVar13[1]._vptr_ExprBase = pp_Var20;
      *(undefined8 *)&pEVar13[1].typeID = 0;
      pEVar13[1].source = (SynBase *)0x0;
      IntrusiveList<ExprBase>::push_back(&local_4d8,pEVar13);
      ClosePendingUpvalues(ctx,pFVar14);
      ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_07,iVar11);
      pTVar16 = pFVar14->type;
      local_4b8 = (undefined1  [8])local_4f8.source;
      uStack_4b0 = local_4f8.function;
      local_3e8 = (undefined1  [8])local_4d8.head;
      pEStack_3e0 = local_4d8.tail;
      pEVar13->typeID = 0x24;
      pEVar13->source = source;
      pEVar13->type = &pTVar16->super_TypeBase;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223ba8;
      pEVar13[1]._vptr_ExprBase = (_func_int **)pFVar14;
      *(ExprVariableDefinition **)&pEVar13[1].typeID = pEVar18;
      pEVar13[1].source = local_4f8.source;
      pEVar13[1].type = (TypeBase *)local_4f8.function;
      pEVar13[1].next = (ExprBase *)0x0;
      *(ExprBase **)&pEVar13[1].listed = local_4d8.head;
      pEVar13[2]._vptr_ExprBase = (_func_int **)local_4d8.tail;
      *(undefined8 *)&pEVar13[2].typeID = 0;
      pEVar13[2].source = (SynBase *)0x0;
      pFVar14->declaration = pEVar13;
      uVar24 = (ctx->definitions).count;
      if (uVar24 == (ctx->definitions).max) {
        SmallArray<ExprBase_*,_128U>::grow(&ctx->definitions,uVar24);
      }
      ppEVar5 = (ctx->definitions).data;
      if (ppEVar5 != (ExprBase **)0x0) {
        pEVar13 = pFVar14->declaration;
        uVar24 = (ctx->definitions).count;
        (ctx->definitions).count = uVar24 + 1;
        ppEVar5[uVar24] = pEVar13;
        IntrusiveList<ExprBase>::push_back(&classDefinition->functions,pEVar13);
        SmallArray<ArgumentData,_2U>::~SmallArray((SmallArray<ArgumentData,_2U> *)&local_348);
        goto LAB_001692d5;
      }
      pcVar23 = "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]";
      goto LAB_00169327;
    }
  }
LAB_001692fb:
  pcVar23 = "void SmallArray<ArgumentData, 2>::push_back(const T &) [T = ArgumentData, N = 2]";
LAB_00169327:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar23);
}

Assistant:

void CreateDefaultClassAssignment(ExpressionContext &ctx, SynBase *source, ExprClassDefinition *classDefinition)
{
	ctx.PopScope(SCOPE_TYPE);

	TypeClass *classType = classDefinition->classType;

	IntrusiveList<VariableHandle> customAssignMembers;

	for(MemberHandle *curr = classType->members.head; curr; curr = curr->next)
	{
		TypeBase *type = curr->variable->type;

		if(isType<TypeRef>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeError>(type))
			continue;

		SmallArray<ArgumentData, 2> arguments(ctx.allocator);

		arguments.push_back(ArgumentData(source, false, NULL, ctx.GetReferenceType(type), NULL));
		arguments.push_back(ArgumentData(source, false, NULL, type, NULL));

		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("="), false))
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, overloads, functions);

			if(!functions.empty())
			{
				SmallArray<unsigned, 32> ratings(ctx.allocator);

				FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, IntrusiveList<TypeHandle>(), arguments, ratings);

				if(bestOverload)
				{
					customAssignMembers.push_back(new (ctx.get<VariableHandle>()) VariableHandle(curr->source, curr->variable));
					continue;
				}
			}
		}

		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("default_assign$_"), false))
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, overloads, functions);

			if(!functions.empty())
			{
				SmallArray<unsigned, 32> ratings(ctx.allocator);

				FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, IntrusiveList<TypeHandle>(), arguments, ratings);

				if(bestOverload)
				{
					customAssignMembers.push_back(new (ctx.get<VariableHandle>()) VariableHandle(curr->source, curr->variable));
					continue;
				}
			}
		}
	}

	if(!customAssignMembers.empty())
	{
		InplaceStr functionName = InplaceStr("default_assign$_");

		SmallArray<ArgumentData, 2> arguments(ctx.allocator);

		arguments.push_back(ArgumentData(source, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$left")), ctx.GetReferenceType(classType), NULL));
		arguments.push_back(ArgumentData(source, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$right")), classType, NULL));

		SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, ctx.GetFunctionType(source, ctx.typeVoid, arguments), ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

		classType->defaultAssign = function;

		// Fill in argument data
		for(unsigned i = 0; i < arguments.size(); i++)
			function->arguments.push_back(arguments[i]);

		CheckFunctionConflict(ctx, source, function->name->name);

		ctx.AddFunction(function);

		ctx.PushScope(function);

		function->functionScope = ctx.scope;

		IntrusiveList<ExprVariableDefinition> variables;

		CreateFunctionArgumentVariables(ctx, source, function, arguments, variables);

		ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

		function->argumentsSize = function->functionScope->dataSize;

		IntrusiveList<ExprBase> expressions;

		for(MemberHandle *curr = classType->members.head; curr; curr = curr->next)
		{
			VariableData *leftArgument = variables.head->variable->variable;

			ExprBase *left = CreateVariableAccess(ctx, source, leftArgument, false);

			ExprBase *leftMember = CreateMemberAccess(ctx, source, left, curr->variable->name, false);

			VariableData *rightArgument = getType<ExprVariableDefinition>(variables.head->next)->variable->variable;

			ExprBase *right = CreateVariableAccess(ctx, source, rightArgument, false);

			ExprBase *rightMember = CreateMemberAccess(ctx, source, right, curr->variable->name, false);

			expressions.push_back(CreateAssignment(ctx, source, leftMember, rightMember));
		}

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(source, ctx.typeVoid), NULL, NULL));

		ClosePendingUpvalues(ctx, function);

		ctx.PopScope(SCOPE_FUNCTION);

		function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

		ctx.definitions.push_back(function->declaration);

		classDefinition->functions.push_back(function->declaration);
	}

	RestoreParentTypeScope(ctx, source, classDefinition->classType);
}